

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O1

void __thiscall
Math_GaussianIntegral_Test::~Math_GaussianIntegral_Test(Math_GaussianIntegral_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Math, GaussianIntegral) {
    Float muSigma[][2] = {{0, 1}, {0, 2}, {0, .1}, {1, 2}, {-2, 1}};
    for (int i = 0; i < sizeof(muSigma) / sizeof(muSigma[0]); ++i) {
        RNG rng;
        for (int j = 0; j < 5; ++j) {
            Float x0 = -5 + 10 + rng.Uniform<Float>();
            Float x1 = -5 + 10 + rng.Uniform<Float>();
            if (x0 > x1)
                pstd::swap(x0, x1);

            Float mu = muSigma[i][0], sigma = muSigma[i][1];
            Float sum = 0;
            int n = 8192;
            for (int k = 0; k < n; ++k) {
                Float u = (k + rng.Uniform<Float>()) / n;
                Float x = Lerp(u, x0, x1);
                sum += Gaussian(x, mu, sigma);
            }
            Float est = (x1 - x0) * sum / n;

            auto compareFloats = [](Float ref, Float v) {
                if (std::abs(ref) < 1e-4)
                    return std::abs(ref - v) < 1e-5;
                return std::abs((ref - v) / ref) < 1e-3;
            };
            Float in = GaussianIntegral(x0, x1, mu, sigma);
            EXPECT_TRUE(compareFloats(est, in)) << est << " vs " << in;
        }
    }
}